

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_value_resource(jx9_value *pVal,void *pUserData)

{
  void *pUserData_local;
  jx9_value *pVal_local;
  
  jx9MemObjRelease(pVal);
  (pVal->x).pOther = pUserData;
  pVal->iFlags = pVal->iFlags & 0xfffffe90U | 0x100;
  return 0;
}

Assistant:

JX9_PRIVATE int jx9_value_resource(jx9_value *pVal, void *pUserData)
{
	/* Invalidate any prior representation */
	jx9MemObjRelease(pVal);
	/* Reflect the new type */
	pVal->x.pOther = pUserData;
	MemObjSetType(pVal, MEMOBJ_RES);
	return JX9_OK;
}